

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

Vec_Int_t * Gia_GenCollectFlopIndexes(char *pStr,int nLutNum,int nLutSize,int nFlops)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  char *__nptr;
  Vec_Int_t *__dest;
  ulong uVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar8 = nLutNum * nLutSize;
  if (nFlops < (int)uVar8) {
    __assert_fail("nLutSize * nLutNum <= nFlops",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x4a,"Vec_Int_t *Gia_GenCollectFlopIndexes(char *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar8 - 1) {
    uVar2 = uVar8;
  }
  if (pStr == (char *)0x0) {
    p->nCap = uVar2;
    if (uVar2 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)(int)uVar2 << 2);
    }
    p->pArray = piVar3;
    p->nSize = uVar8;
    auVar1 = _DAT_0094e250;
    if ((int)uVar8 < 1) {
      return p;
    }
    lVar5 = (ulong)uVar8 - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar4 = 0;
    auVar9 = auVar9 ^ _DAT_0094e250;
    auVar10 = _DAT_0094e240;
    do {
      auVar11 = auVar10 ^ auVar1;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        piVar3[uVar4] = (int)uVar4;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        piVar3[uVar4 + 1] = (int)uVar4 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar5 + 2;
    } while ((uVar8 + 1 & 0xfffffffe) != uVar4);
    return p;
  }
  p->nSize = 0;
  p->nCap = uVar2;
  if (uVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)(int)uVar2 << 2);
  }
  p->pArray = piVar3;
  __nptr = strtok(pStr,", ");
  while (__nptr != (char *)0x0) {
    uVar2 = atoi(__nptr);
    if (nFlops <= (int)uVar2) {
      printf("Flop index (%d) exceeds the number of flops (%d).\n",(ulong)uVar2,(ulong)(uint)nFlops)
      ;
      break;
    }
    Vec_IntPush(p,uVar2);
    __nptr = strtok((char *)0x0,", ");
  }
  if (p->nSize == uVar8) {
    if (uVar8 == 0) {
      return p;
    }
    __dest = (Vec_Int_t *)malloc((long)(int)uVar8 << 2);
    piVar3 = p->pArray;
    memcpy(__dest,piVar3,(long)(int)uVar8 << 2);
    if ((int)uVar8 < 2) {
      pVVar6 = p;
      if (__dest == (Vec_Int_t *)0x0) {
        return p;
      }
      goto LAB_0079d7ae;
    }
    qsort(__dest,(ulong)uVar8,4,Vec_IntSortCompare1);
    iVar7 = 1;
    uVar4 = 1;
    do {
      if ((&__dest->nCap)[uVar4] != *(int *)((long)__dest + uVar4 * 4 + -4)) {
        lVar5 = (long)iVar7;
        iVar7 = iVar7 + 1;
        (&__dest->nCap)[lVar5] = (&__dest->nCap)[uVar4];
      }
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
    free(__dest);
    if (uVar8 - iVar7 == 0) {
      return p;
    }
    printf("Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n",
           (ulong)(uVar8 - iVar7));
  }
  else {
    printf("Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n",(ulong)uVar8);
    piVar3 = p->pArray;
  }
  if (piVar3 != (int *)0x0) {
    free(piVar3);
  }
  pVVar6 = (Vec_Int_t *)0x0;
  __dest = p;
LAB_0079d7ae:
  free(__dest);
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_GenCollectFlopIndexes( char * pStr, int nLutNum, int nLutSize, int nFlops )
{
    int nDups;
    char * pTemp;
    Vec_Int_t * vFlops;
    assert( nLutSize * nLutNum <= nFlops );
    if ( pStr == NULL )
        return Vec_IntStartNatural( nLutNum * nLutSize );
    vFlops = Vec_IntAlloc( nLutNum * nLutSize );
    pTemp = strtok( pStr, ", " );
    while ( pTemp )
    {
        int iFlop = atoi(pTemp);
        if ( iFlop >= nFlops )
        {
            printf( "Flop index (%d) exceeds the number of flops (%d).\n", iFlop, nFlops );
            break;
        }
        Vec_IntPush( vFlops, iFlop );
        pTemp = strtok( NULL, ", " );
    }
    if ( Vec_IntSize(vFlops) != nLutNum * nLutSize )
    {
        printf( "Gia_GenCollectFlopIndexes: Expecting %d flop indexes (instead of %d).\n", nLutNum * nLutSize, Vec_IntSize(vFlops) );
        Vec_IntFree( vFlops );
        return NULL;
    }
    nDups = Vec_IntCountDuplicates(vFlops);
    if ( nDups )
    {
        printf( "Gia_GenCollectFlopIndexes: There are %d duplicated flops in the list.\n", nDups );
        Vec_IntFree( vFlops );
        return NULL;
    }
    return vFlops;
}